

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFSPermissions.cxx
# Opt level: O0

bool cmFSPermissions::stringToModeT(string *arg,mode_t *permissions)

{
  bool bVar1;
  mode_t *permissions_local;
  string *arg_local;
  
  bVar1 = std::operator==(arg,"OWNER_READ");
  if (bVar1) {
    *permissions = *permissions | 0x100;
  }
  else {
    bVar1 = std::operator==(arg,"OWNER_WRITE");
    if (bVar1) {
      *permissions = *permissions | 0x80;
    }
    else {
      bVar1 = std::operator==(arg,"OWNER_EXECUTE");
      if (bVar1) {
        *permissions = *permissions | 0x40;
      }
      else {
        bVar1 = std::operator==(arg,"GROUP_READ");
        if (bVar1) {
          *permissions = *permissions | 0x20;
        }
        else {
          bVar1 = std::operator==(arg,"GROUP_WRITE");
          if (bVar1) {
            *permissions = *permissions | 0x10;
          }
          else {
            bVar1 = std::operator==(arg,"GROUP_EXECUTE");
            if (bVar1) {
              *permissions = *permissions | 8;
            }
            else {
              bVar1 = std::operator==(arg,"WORLD_READ");
              if (bVar1) {
                *permissions = *permissions | 4;
              }
              else {
                bVar1 = std::operator==(arg,"WORLD_WRITE");
                if (bVar1) {
                  *permissions = *permissions | 2;
                }
                else {
                  bVar1 = std::operator==(arg,"WORLD_EXECUTE");
                  if (bVar1) {
                    *permissions = *permissions | 1;
                  }
                  else {
                    bVar1 = std::operator==(arg,"SETUID");
                    if (bVar1) {
                      *permissions = *permissions | 0x800;
                    }
                    else {
                      bVar1 = std::operator==(arg,"SETGID");
                      if (!bVar1) {
                        return false;
                      }
                      *permissions = *permissions | 0x400;
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return true;
}

Assistant:

bool cmFSPermissions::stringToModeT(std::string const& arg,
                                    mode_t& permissions)
{
  if (arg == "OWNER_READ") {
    permissions |= mode_owner_read;
  } else if (arg == "OWNER_WRITE") {
    permissions |= mode_owner_write;
  } else if (arg == "OWNER_EXECUTE") {
    permissions |= mode_owner_execute;
  } else if (arg == "GROUP_READ") {
    permissions |= mode_group_read;
  } else if (arg == "GROUP_WRITE") {
    permissions |= mode_group_write;
  } else if (arg == "GROUP_EXECUTE") {
    permissions |= mode_group_execute;
  } else if (arg == "WORLD_READ") {
    permissions |= mode_world_read;
  } else if (arg == "WORLD_WRITE") {
    permissions |= mode_world_write;
  } else if (arg == "WORLD_EXECUTE") {
    permissions |= mode_world_execute;
  } else if (arg == "SETUID") {
    permissions |= mode_setuid;
  } else if (arg == "SETGID") {
    permissions |= mode_setgid;
  } else {
    return false;
  }
  return true;
}